

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

void __thiscall YAML::Stream::Stream(Stream *this,istream *input)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  UtfIntroCharType UVar4;
  int_type iVar5;
  void *pvVar6;
  long lVar7;
  Stream *in_RSI;
  undefined8 *in_RDI;
  int nUngets;
  UtfIntroState newState;
  UtfIntroCharType charType;
  int_type ch;
  UtfIntroState state;
  int nIntroUsed;
  int_type intro [4];
  undefined8 in_stack_ffffffffffffff70;
  Stream *in_stack_ffffffffffffff78;
  int local_50;
  uint local_40;
  int local_3c;
  int local_38 [10];
  Stream *local_10;
  
  *in_RDI = in_RSI;
  local_10 = in_RSI;
  Mark::Mark((Mark *)(in_RDI + 1));
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  std::deque<char,_std::allocator<char>_>::deque((deque<char,_std::allocator<char>_> *)0xf2a34c);
  pvVar6 = operator_new__(0x800);
  in_RDI[0xd] = pvVar6;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  bVar2 = std::ios::operator!((ios *)((long)&local_10->m_input +
                                     *(long *)(local_10->m_input + -0x18)));
  if ((bVar2 & 1) == 0) {
    memset(local_38,0,0x10);
    local_3c = 0;
    local_40 = 0;
    while (((s_introFinalState[local_40] ^ 0xff) & 1) != 0) {
      iVar3 = std::istream::get();
      lVar7 = (long)local_3c;
      local_3c = local_3c + 1;
      local_38[lVar7] = iVar3;
      UVar4 = IntroCharTypeOf((int_type)in_stack_ffffffffffffff70);
      uVar1 = *(uint *)(s_introTransitions + (ulong)UVar4 * 4 + (ulong)local_40 * 0x20);
      local_50 = (int)(char)s_introUngetCount[(ulong)UVar4 + (ulong)local_40 * 8];
      local_40 = uVar1;
      if (0 < local_50) {
        std::ios::clear((int)local_10 + (int)*(undefined8 *)(local_10->m_input + -0x18));
        for (; 0 < local_50; local_50 = local_50 + -1) {
          iVar5 = std::char_traits<char>::eof();
          local_3c = local_3c + -1;
          if (iVar5 != local_38[local_3c]) {
            in_stack_ffffffffffffff78 = local_10;
            std::char_traits<char>::to_char_type(local_38 + local_3c);
            std::istream::putback((char)in_stack_ffffffffffffff78);
          }
        }
      }
    }
    switch((ulong)(local_40 - 4)) {
    case 0:
      *(undefined4 *)((long)in_RDI + 0x14) = 4;
      break;
    case 1:
      *(undefined4 *)((long)in_RDI + 0x14) = 2;
      break;
    default:
      *(undefined4 *)((long)in_RDI + 0x14) = 0;
      break;
    case 6:
      *(undefined4 *)((long)in_RDI + 0x14) = 1;
      break;
    case 7:
      *(undefined4 *)((long)in_RDI + 0x14) = 3;
      break;
    case 0xd:
      *(undefined4 *)((long)in_RDI + 0x14) = 0;
    }
    ReadAheadTo(in_stack_ffffffffffffff78,(ulong)(local_40 - 4));
  }
  return;
}

Assistant:

Stream::Stream(std::istream& input)
    : m_input(input),
      m_mark{},
      m_charSet{},
      m_readahead{},
      m_pPrefetched(new unsigned char[YAML_PREFETCH_SIZE]),
      m_nPrefetchedAvailable(0),
      m_nPrefetchedUsed(0) {
  using char_traits = std::istream::traits_type;

  if (!input)
    return;

  // Determine (or guess) the character-set by reading the BOM, if any.  See
  // the YAML specification for the determination algorithm.
  char_traits::int_type intro[4]{};
  int nIntroUsed = 0;
  UtfIntroState state = uis_start;
  for (; !s_introFinalState[state];) {
    std::istream::int_type ch = input.get();
    intro[nIntroUsed++] = ch;
    UtfIntroCharType charType = IntroCharTypeOf(ch);
    UtfIntroState newState = s_introTransitions[state][charType];
    int nUngets = s_introUngetCount[state][charType];
    if (nUngets > 0) {
      input.clear();
      for (; nUngets > 0; --nUngets) {
        if (char_traits::eof() != intro[--nIntroUsed])
          input.putback(char_traits::to_char_type(intro[nIntroUsed]));
      }
    }
    state = newState;
  }

  switch (state) {
    case uis_utf8:
      m_charSet = utf8;
      break;
    case uis_utf16le:
      m_charSet = utf16le;
      break;
    case uis_utf16be:
      m_charSet = utf16be;
      break;
    case uis_utf32le:
      m_charSet = utf32le;
      break;
    case uis_utf32be:
      m_charSet = utf32be;
      break;
    default:
      m_charSet = utf8;
      break;
  }

  ReadAheadTo(0);
}